

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.hpp
# Opt level: O0

CodeOp Indexing::CodeTree::CodeOp::getSuccess<Kernel::Clause>(Clause *ptr)

{
  CodeOp res;
  Clause *data;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  CodeOp local_10;
  
  uVar1 = 0;
  data = (Clause *)&local_10;
  setAlternative((CodeOp *)data,(CodeOp *)0x0);
  _setData<Kernel::Clause>((CodeOp *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),data);
  _setInstruction((CodeOp *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),(uint)((ulong)data >> 0x20));
  return local_10;
}

Assistant:

static CodeOp getSuccess(T* ptr)
    {
      ASS(ptr); //data has to be a non-zero pointer
      CodeOp res;
      res.setAlternative(0);
      res._setData(ptr);
      res._setInstruction(SUCCESS_OR_FAIL);
      ASS(res.isSuccess());
      return res;
    }